

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

DictionaryEntry * DictionaryEntry::CreateInstance(DictionaryEntryType item_type)

{
  Entry<ON_MeshParameters> *this;
  Entry<ON_wString> *this_00;
  undefined *puVar1;
  Entry<ON_Geometry> *this_01;
  Entry<ON_Object> *this_02;
  
  this_01 = (Entry<ON_Geometry> *)0x0;
  switch(item_type) {
  case Boolean:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined1 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<bool>::vtable;
    break;
  case UInt8:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined1 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<unsigned_char>::vtable;
    break;
  case Int8:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined1 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<signed_char>::vtable;
    break;
  case Int16:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined2 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<short>::vtable;
    break;
  case UInt16:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined2 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<unsigned_short>::vtable;
    break;
  case Int32:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined4 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<int>::vtable;
    break;
  case UInt32:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined4 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<unsigned_int>::vtable;
    break;
  case Int64:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    puVar1 = &Entry<long>::vtable;
    break;
  case Float:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined4 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<float>::vtable;
    break;
  case Double:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    puVar1 = &Entry<double>::vtable;
    break;
  case Uuid:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x18);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<ON_UUID_struct>::vtable;
    break;
  case String:
    this_00 = (Entry<ON_wString> *)operator_new(0x10);
    Entry<ON_wString>::Entry(this_00);
    return (DictionaryEntry *)this_00;
  case BooleanArray:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081bde8;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<bool>>::vtable;
    break;
  case UInt8Array:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081bed8;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<unsigned_char>>::vtable;
    break;
  case Int8Array:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081bfc8;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<signed_char>>::vtable;
    break;
  case Int16Array:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081c0b8;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<short>>::vtable;
    break;
  case Int32Array:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081add8;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<int>>::vtable;
    break;
  case FloatArray:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081c258;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<float>>::vtable;
    break;
  case DoubleArray:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081c348;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<double>>::vtable;
    break;
  case UuidArray:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_0081c438;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_SimpleArray<ON_UUID_struct>>::vtable;
    break;
  case StringArray:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)&PTR__ON_ClassArray_0081b0a8;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    puVar1 = &Entry<ON_ClassArray<ON_wString>>::vtable;
    break;
  case Color:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    *(undefined4 *)
     &(this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.
      super_ON_Object._vptr_ON_Object = 0;
    puVar1 = &Entry<ON_Color>::vtable;
    break;
  case Point2i:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    puVar1 = &Entry<ON_2iPoint>::vtable;
    break;
  case Point2f:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    puVar1 = &Entry<ON_2fPoint>::vtable;
    break;
  case Rect4i:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x18);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<ON_4iRect>::vtable;
    break;
  default:
    goto switchD_003bc59d_caseD_1a;
  case Size2i:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x10);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    puVar1 = &Entry<ON_2iSize>::vtable;
    break;
  case Point2d:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x18);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<ON_2dPoint>::vtable;
    break;
  case Point3d:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<ON_3dPoint>::vtable;
    break;
  case Point4d:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x28);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    puVar1 = &Entry<ON_4dPoint>::vtable;
    break;
  case Vector2d:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x18);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<ON_2dVector>::vtable;
    break;
  case Vector3d:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x20);
    this_01[1].super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>.super_DictionaryEntry =
         (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<ON_3dVector>::vtable;
    break;
  case ArchivableDictionary:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x18);
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    _vptr_ON_Object = (_func_int **)0x0;
    (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).m_value.super_ON_Object.
    m_userdata_list = (ON_UserData *)0x0;
    puVar1 = &Entry<std::shared_ptr<ON_ArchivableDictionary>>::vtable;
    break;
  case Object:
    this_02 = (Entry<ON_Object> *)operator_new(0x18);
    Entry<ON_Object>::Entry(this_02);
    return (DictionaryEntry *)this_02;
  case MeshParameters:
    this = (Entry<ON_MeshParameters> *)operator_new(0xe8);
    Entry<ON_MeshParameters>::Entry(this);
    return (DictionaryEntry *)this;
  case Geometry:
    this_01 = (Entry<ON_Geometry> *)operator_new(0x18);
    Entry<ON_Geometry>::Entry(this_01);
    goto switchD_003bc59d_caseD_1a;
  }
  (this_01->super_DictionaryEntryT<ON_Geometry,_(DictionaryEntryType)47>).super_DictionaryEntry.
  _vptr_DictionaryEntry = (_func_int **)(puVar1 + 0x10);
switchD_003bc59d_caseD_1a:
  return (DictionaryEntry *)this_01;
}

Assistant:

DictionaryEntry* DictionaryEntry::CreateInstance(enum DictionaryEntryType item_type)
{
  switch (item_type)
  {
  // some basic data types
  case Entry<bool>::Type: return new Entry<bool>;
  case Entry<std::uint8_t>::Type: return new Entry<std::uint8_t>;
  case Entry<std::int8_t>::Type: return new Entry<std::int8_t>;
  case Entry<std::int16_t>::Type: return new Entry<std::int16_t>;
  case Entry<std::uint16_t>::Type: return new Entry<std::uint16_t>;
  case Entry<std::int32_t>::Type: return new Entry<std::int32_t>;
  case Entry<std::uint32_t>::Type: return new Entry<std::uint32_t>;
  case Entry<std::int64_t>::Type: return new Entry<std::int64_t>;
  case Entry<float>::Type: return new Entry<float>;
  case Entry<double>::Type: return new Entry<double>;
  case Entry<ON_UUID>::Type: return new Entry<ON_UUID>;
  case Entry<ON_wString>::Type: return new Entry<ON_wString>;

  // array of basic data types
  case Entry<ON_SimpleArray<bool>>::Type: return new Entry<ON_SimpleArray<bool>>;
  case Entry<ON_SimpleArray<std::uint8_t>>::Type: return new Entry<ON_SimpleArray<std::uint8_t>>;
  case Entry<ON_SimpleArray<std::int8_t>>::Type: return new Entry<ON_SimpleArray<std::int8_t>>;
  case Entry<ON_SimpleArray<std::int16_t>>::Type: return new Entry<ON_SimpleArray<std::int16_t>>;
  case Entry<ON_SimpleArray<std::int32_t>>::Type: return new Entry<ON_SimpleArray<std::int32_t>>;
  case Entry<ON_SimpleArray<float>>::Type: return new Entry<ON_SimpleArray<float>>;
  case Entry<ON_SimpleArray<double>>::Type: return new Entry<ON_SimpleArray<double>>;
  case Entry<ON_SimpleArray<ON_UUID>>::Type: return new Entry<ON_SimpleArray<ON_UUID>>;
  case Entry<ON_ClassArray<ON_wString>>::Type: return new Entry<ON_ClassArray<ON_wString>>;

  case Entry<ON_Color>::Type: return new Entry<ON_Color>;
  case Entry<ON_2iPoint>::Type: return new Entry<ON_2iPoint>;
  case Entry<ON_2fPoint>::Type: return new Entry<ON_2fPoint>;
  case Entry<ON_4iRect>::Type: return new Entry<ON_4iRect>;
  //case Entry<ON_4fRect>::Type: return new Entry<ON_4fRect>;
  case Entry<ON_2iSize>::Type: return new Entry<ON_2iSize>;
  //case Entry<ON_2fSize>::Type: return new Entry<ON_2fSize>;
  //case Entry<ON_Font>::Type: return new Entry<ON_Font>;

  //case Entry<ON_Interval>::Type: return new Entry<ON_Interval>;
  case Entry<ON_2dPoint>::Type: return new Entry<ON_2dPoint>;
  case Entry<ON_3dPoint>::Type: return new Entry<ON_3dPoint>;
  case Entry<ON_4dPoint>::Type: return new Entry<ON_4dPoint>;
  case Entry<ON_2dVector>::Type: return new Entry<ON_2dVector>;
  case Entry<ON_3dVector>::Type: return new Entry<ON_3dVector>;
  //case Entry<ON_BoundingBox>::Type: return new Entry<ON_BoundingBox>;
  //case Entry<ON_3dRay>::Type: return new Entry<ON_3dRay>;
  //case Entry<ON_PlaneEquation>::Type: return new Entry<ON_PlaneEquation>;
  //case Entry<ON_Xform>::Type: return new Entry<ON_Xform>;
  //case Entry<ON_Plane>::Type: return new Entry<ON_Plane>;
  //case Entry<ON_Line>::Type: return new Entry<ON_Line>;
  //case Entry<ON_3fPoint>::Type: return new Entry<ON_3fPoint>;
  //case Entry<ON_3fVector>::Type: return new Entry<ON_3fVector>;

  case DictionaryEntryType::Object: return new Entry<ON_Object>;
  case DictionaryEntryType::MeshParameters: return new Entry<ON_MeshParameters>;
  case DictionaryEntryType::Geometry: return new Entry<ON_Geometry>;
  case DictionaryEntryType::ArchivableDictionary: return new Entry<ON_ArchivableDictionaryPtr>;
  default: return nullptr;
  }
}